

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintPhp(TidyDocImpl *doc,uint indent,Node *node)

{
  int iVar1;
  
  iVar1 = *(int *)((doc->config).value + 0x5e);
  AddString(&doc->pprint,"<?");
  PPrintText(doc,0x10,indent,node);
  AddString(&doc->pprint,"?>");
  if (iVar1 != 0) {
    PCondFlushLine(doc,indent);
    return;
  }
  return;
}

Assistant:

static void PPrintPhp( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapPhp = cfgBool( doc, TidyWrapPhp );
    /* uint saveWrap = WrapOffCond( doc, !wrapPhp  ); */

    AddString( pprint, "<?" );
    PPrintText( doc, CDATA, indent, node );
    AddString( pprint, "?>" );

    /* Issue #437 - add a new line if 'wrap-php' is on */
    if (wrapPhp)
        PCondFlushLine( doc, indent ); 
       
    /* WrapOn( doc, saveWrap ); */
}